

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::disconnectTiming(CoreBroker *this,ActionMessage *command)

{
  BrokerState BVar1;
  int iVar2;
  pointer pBVar3;
  undefined8 in_RSI;
  long in_RDI;
  MessageProcessingResult res;
  GlobalFederateId local_18 [2];
  undefined8 local_10;
  
  if ((*(byte *)(in_RDI + 0x211) & 1) != 0) {
    if ((*(byte *)(in_RDI + 0x212) & 1) == 0) {
      BVar1 = BrokerBase::getBrokerState((BrokerBase *)0x5e8db5);
      if (INITIALIZING < BVar1) {
        pBVar3 = CLI::std::
                 unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                               *)0x5e8dd4);
        iVar2 = (*pBVar3->_vptr_BaseTimeCoordinator[3])();
        if ((char)iVar2 != '\0') {
          pBVar3 = CLI::std::
                   unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                 *)0x5e8dfb);
          memset(local_18,0,4);
          GlobalFederateId::GlobalFederateId(local_18);
          iVar2 = (*pBVar3->_vptr_BaseTimeCoordinator[9])(pBVar3,(ulong)(uint)local_18[0].gid);
          if ((char)iVar2 == '\0') {
            *(undefined1 *)(in_RDI + 0x212) = 1;
          }
        }
      }
    }
    else {
      local_10 = in_RSI;
      pBVar3 = CLI::std::
               unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                             *)0x5e8e5a);
      iVar2 = (*pBVar3->_vptr_BaseTimeCoordinator[3])(pBVar3,local_10);
      if ((char)iVar2 != '\0') {
        pBVar3 = CLI::std::
                 unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                               *)0x5e8e81);
        (*pBVar3->_vptr_BaseTimeCoordinator[2])();
      }
    }
  }
  return;
}

Assistant:

void CoreBroker::disconnectTiming(ActionMessage& command)
{
    if (hasTimeDependency) {
        if (!enteredExecutionMode) {
            if (getBrokerState() >= BrokerState::OPERATING) {
                if (timeCoord->processTimeMessage(command) != TimeProcessingResult::NOT_PROCESSED) {
                    auto res = timeCoord->checkExecEntry();
                    if (res == MessageProcessingResult::NEXT_STEP) {
                        enteredExecutionMode = true;
                    }
                }
            }
        } else {
            if (timeCoord->processTimeMessage(command) != TimeProcessingResult::NOT_PROCESSED) {
                timeCoord->updateTimeFactors();
            }
        }
    }
}